

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glx_context.c
# Opt level: O2

GLFWbool chooseGLXFBConfig(_GLFWfbconfig *desired,GLXFBConfig *result)

{
  GLXFBConfig fbconfig;
  int iVar1;
  uint uVar2;
  GLFWbool GVar3;
  char *__s1;
  GLXFBConfig *pp_Var4;
  _GLFWfbconfig *alternatives;
  XVisualInfo *pXVar5;
  _GLFWfbconfig *p_Var6;
  long lVar7;
  bool bVar8;
  uint local_54;
  int nativeCount;
  GLXFBConfig *local_40;
  _GLFWfbconfig *local_38;
  
  __s1 = (*_glfw.glx.GetClientString)(_glfw.x11.display,1);
  if (__s1 == (char *)0x0) {
    bVar8 = true;
  }
  else {
    iVar1 = strcmp(__s1,"Chromium");
    bVar8 = iVar1 != 0;
  }
  pp_Var4 = (*_glfw.glx.GetFBConfigs)(_glfw.x11.display,_glfw.x11.screen,&nativeCount);
  iVar1 = nativeCount;
  if (pp_Var4 == (GLXFBConfig *)0x0 || nativeCount == 0) {
    uVar2 = 0;
    _glfwInputError(0x10006,"GLX: No GLXFBConfigs returned");
  }
  else {
    local_40 = result;
    alternatives = (_GLFWfbconfig *)calloc((long)nativeCount,0x50);
    local_54 = 0;
    local_38 = desired;
    for (lVar7 = 0; lVar7 < iVar1; lVar7 = lVar7 + 1) {
      fbconfig = pp_Var4[lVar7];
      uVar2 = getGLXFBConfigAttrib(fbconfig,0x8011);
      if ((uVar2 & 1) == 0) {
        uVar2 = getGLXFBConfigAttrib(fbconfig,0x8011);
        if ((uVar2 & 4) != 0) goto LAB_00117f9a;
      }
      else {
LAB_00117f9a:
        uVar2 = getGLXFBConfigAttrib(fbconfig,0x8010);
        if (!(bool)(bVar8 & (uVar2 & 1) == 0)) {
          iVar1 = getGLXFBConfigAttrib(fbconfig,5);
          if (iVar1 == desired->doublebuffer) {
            p_Var6 = alternatives + (int)local_54;
            if (desired->transparent != 0) {
              pXVar5 = (*_glfw.glx.GetVisualFromFBConfig)(_glfw.x11.display,fbconfig);
              if (pXVar5 != (XVisualInfo *)0x0) {
                GVar3 = _glfwIsVisualTransparentX11(pXVar5->visual);
                p_Var6->transparent = GVar3;
                (*_glfw.x11.xlib.Free)(pXVar5);
              }
            }
            iVar1 = getGLXFBConfigAttrib(fbconfig,8);
            p_Var6->redBits = iVar1;
            iVar1 = getGLXFBConfigAttrib(fbconfig,9);
            p_Var6->greenBits = iVar1;
            iVar1 = getGLXFBConfigAttrib(fbconfig,10);
            p_Var6->blueBits = iVar1;
            iVar1 = getGLXFBConfigAttrib(fbconfig,0xb);
            p_Var6->alphaBits = iVar1;
            iVar1 = getGLXFBConfigAttrib(fbconfig,0xc);
            p_Var6->depthBits = iVar1;
            iVar1 = getGLXFBConfigAttrib(fbconfig,0xd);
            p_Var6->stencilBits = iVar1;
            iVar1 = getGLXFBConfigAttrib(fbconfig,0xe);
            p_Var6->accumRedBits = iVar1;
            iVar1 = getGLXFBConfigAttrib(fbconfig,0xf);
            p_Var6->accumGreenBits = iVar1;
            iVar1 = getGLXFBConfigAttrib(fbconfig,0x10);
            p_Var6->accumBlueBits = iVar1;
            iVar1 = getGLXFBConfigAttrib(fbconfig,0x11);
            p_Var6->accumAlphaBits = iVar1;
            iVar1 = getGLXFBConfigAttrib(fbconfig,7);
            p_Var6->auxBuffers = iVar1;
            iVar1 = getGLXFBConfigAttrib(fbconfig,6);
            if (iVar1 != 0) {
              p_Var6->stereo = 1;
            }
            uVar2 = getGLXFBConfigAttrib(fbconfig,0x8011);
            p_Var6->floatbuffer = uVar2 >> 2 & 1;
            if (_glfw.glx.ARB_multisample != 0) {
              iVar1 = getGLXFBConfigAttrib(fbconfig,0x186a1);
              p_Var6->samples = iVar1;
            }
            if (_glfw.glx.EXT_framebuffer_sRGB != 0 || _glfw.glx.ARB_framebuffer_sRGB != 0) {
              iVar1 = getGLXFBConfigAttrib(fbconfig,0x20b2);
              p_Var6->sRGB = iVar1;
            }
            p_Var6->handle = (uintptr_t)fbconfig;
            local_54 = local_54 + 1;
            desired = local_38;
          }
        }
      }
      iVar1 = nativeCount;
    }
    p_Var6 = _glfwChooseFBConfig(desired,alternatives,local_54);
    if (p_Var6 != (_GLFWfbconfig *)0x0) {
      *local_40 = (GLXFBConfig)p_Var6->handle;
    }
    uVar2 = (uint)(p_Var6 != (_GLFWfbconfig *)0x0);
    (*_glfw.x11.xlib.Free)(pp_Var4);
    free(alternatives);
  }
  return uVar2;
}

Assistant:

static GLFWbool chooseGLXFBConfig(const _GLFWfbconfig* desired,
                                  GLXFBConfig* result)
{
    GLXFBConfig* nativeConfigs;
    _GLFWfbconfig* usableConfigs;
    const _GLFWfbconfig* closest;
    int i, nativeCount, usableCount;
    const char* vendor;
    GLFWbool trustWindowBit = GLFW_TRUE;

    // HACK: This is a (hopefully temporary) workaround for Chromium
    //       (VirtualBox GL) not setting the window bit on any GLXFBConfigs
    vendor = glXGetClientString(_glfw.x11.display, GLX_VENDOR);
    if (vendor && strcmp(vendor, "Chromium") == 0)
        trustWindowBit = GLFW_FALSE;

    nativeConfigs =
        glXGetFBConfigs(_glfw.x11.display, _glfw.x11.screen, &nativeCount);
    if (!nativeConfigs || !nativeCount)
    {
        _glfwInputError(GLFW_API_UNAVAILABLE, "GLX: No GLXFBConfigs returned");
        return GLFW_FALSE;
    }

    usableConfigs = calloc(nativeCount, sizeof(_GLFWfbconfig));
    usableCount = 0;

    for (i = 0;  i < nativeCount;  i++)
    {
        const GLXFBConfig n = nativeConfigs[i];
        _GLFWfbconfig* u = usableConfigs + usableCount;

        // Only consider RGBA GLXFBConfigs
        if (!(getGLXFBConfigAttrib(n, GLX_RENDER_TYPE) & GLX_RGBA_BIT) &&
            !(getGLXFBConfigAttrib(n, GLX_RENDER_TYPE) & GLX_RGBA_FLOAT_BIT))
            continue;

        // Only consider window GLXFBConfigs
        if (!(getGLXFBConfigAttrib(n, GLX_DRAWABLE_TYPE) & GLX_WINDOW_BIT))
        {
            if (trustWindowBit)
                continue;
        }

        if (getGLXFBConfigAttrib(n, GLX_DOUBLEBUFFER) != desired->doublebuffer)
            continue;

        if (desired->transparent)
        {
            XVisualInfo* vi = glXGetVisualFromFBConfig(_glfw.x11.display, n);
            if (vi)
            {
                u->transparent = _glfwIsVisualTransparentX11(vi->visual);
                XFree(vi);
            }
        }

        u->redBits = getGLXFBConfigAttrib(n, GLX_RED_SIZE);
        u->greenBits = getGLXFBConfigAttrib(n, GLX_GREEN_SIZE);
        u->blueBits = getGLXFBConfigAttrib(n, GLX_BLUE_SIZE);

        u->alphaBits = getGLXFBConfigAttrib(n, GLX_ALPHA_SIZE);
        u->depthBits = getGLXFBConfigAttrib(n, GLX_DEPTH_SIZE);
        u->stencilBits = getGLXFBConfigAttrib(n, GLX_STENCIL_SIZE);

        u->accumRedBits = getGLXFBConfigAttrib(n, GLX_ACCUM_RED_SIZE);
        u->accumGreenBits = getGLXFBConfigAttrib(n, GLX_ACCUM_GREEN_SIZE);
        u->accumBlueBits = getGLXFBConfigAttrib(n, GLX_ACCUM_BLUE_SIZE);
        u->accumAlphaBits = getGLXFBConfigAttrib(n, GLX_ACCUM_ALPHA_SIZE);

        u->auxBuffers = getGLXFBConfigAttrib(n, GLX_AUX_BUFFERS);

        if (getGLXFBConfigAttrib(n, GLX_STEREO))
            u->stereo = GLFW_TRUE;

        u->floatbuffer = (getGLXFBConfigAttrib(n, GLX_RENDER_TYPE) & GLX_RGBA_FLOAT_BIT) != 0;

        if (_glfw.glx.ARB_multisample)
            u->samples = getGLXFBConfigAttrib(n, GLX_SAMPLES);

        if (_glfw.glx.ARB_framebuffer_sRGB || _glfw.glx.EXT_framebuffer_sRGB)
            u->sRGB = getGLXFBConfigAttrib(n, GLX_FRAMEBUFFER_SRGB_CAPABLE_ARB);

        u->handle = (uintptr_t) n;
        usableCount++;
    }

    closest = _glfwChooseFBConfig(desired, usableConfigs, usableCount);
    if (closest)
        *result = (GLXFBConfig) closest->handle;

    XFree(nativeConfigs);
    free(usableConfigs);

    return closest != NULL;
}